

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

void __thiscall gfield::reduce<26>(gfield *this,bigint<26> *result)

{
  digit *__dest;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  bigint<13> local_50;
  
  uVar3 = result->len;
  uVar7 = 0xc;
  if ((int)uVar3 < 0xc) {
    uVar7 = uVar3;
  }
  (this->super_gfint).len = uVar7;
  lVar9 = (long)(int)uVar7;
  memcpy((this->super_gfint).digits,result->digits,lVar9 * 2);
  if ((uVar3 != 0) && ((this->super_gfint).digits[lVar9 + -1] == 0)) {
    do {
      lVar6 = lVar9;
      if (lVar6 == 1) {
        uVar7 = 0;
        break;
      }
      uVar7 = uVar7 - 1;
      lVar9 = lVar6 + -1;
    } while ((this->super_gfint).digits[lVar6 + -2] == 0);
    (this->super_gfint).len = (int)lVar6 + -1;
  }
  uVar3 = result->len;
  if ((int)uVar3 < 0xd) {
    if (P.super_gfint.len <= (int)uVar7) {
      if ((int)uVar7 <= P.super_gfint.len) {
        uVar5 = (ulong)uVar7;
        do {
          if ((int)uVar5 < 1) break;
          uVar1 = (this->super_gfint).digits[uVar5 - 1];
          uVar2 = P.super_gfint.digits[uVar5 - 1];
          if (uVar1 < uVar2) {
            return;
          }
          uVar5 = uVar5 - 1;
        } while (uVar1 <= uVar2);
      }
      bigint<13>::sub<13,13>(&this->super_gfint,&this->super_gfint,&P.super_gfint);
      return;
    }
  }
  else {
    __dest = local_50.digits;
    uVar8 = uVar3 - 0xc;
    uVar7 = 4;
    if (uVar8 < 4) {
      uVar7 = uVar8;
    }
    memcpy(__dest,result->digits + 0xc,(ulong)(uVar7 * 2));
    if (uVar3 < 0x10) {
      memset(__dest + uVar8,0,(ulong)uVar3 * -2 + 0x20);
    }
    local_50.digits[4] = local_50.digits[0];
    local_50.digits[5] = local_50.digits[1];
    local_50.digits[6] = local_50.digits[2];
    local_50.digits[7] = local_50.digits[3];
    lVar9 = 8;
    if ((ulong)local_50.digits._0_8_ >> 0x30 == 0) {
      lVar6 = 8;
      do {
        if (lVar6 == 1) {
          lVar9 = 0;
          break;
        }
        lVar9 = lVar6 + -1;
        lVar4 = lVar6 + -2;
        lVar6 = lVar9;
      } while (local_50.digits[lVar4] == 0);
    }
    local_50.len = (int)lVar9;
    add<13,13>(this,&this->super_gfint,&local_50);
    uVar3 = result->len;
    if (0x10 < (int)uVar3) {
      local_50.digits[0] = 0;
      local_50.digits[1] = 0;
      local_50.digits[2] = 0;
      local_50.digits[3] = 0;
      uVar7 = 4;
      if (uVar3 - 0x10 < 4) {
        uVar7 = uVar3 - 0x10;
      }
      memcpy(local_50.digits + 4,result->digits + 0x10,(ulong)(uVar7 * 2));
      if (uVar3 < 0x14) {
        memset(__dest + (uVar3 - 0xc),0,(ulong)uVar3 * -2 + 0x28);
      }
      local_50.digits[8] = local_50.digits[4];
      local_50.digits[9] = local_50.digits[5];
      local_50.digits[10] = local_50.digits[6];
      local_50.digits[0xb] = local_50.digits[7];
      local_50.len = 0xc;
      lVar9 = 0xd;
      do {
        if (local_50.digits[lVar9 + -2] != 0) break;
        local_50.len = (int)lVar9 + -2;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 1);
      add<13,13>(this,&this->super_gfint,&local_50);
      uVar3 = result->len;
      if (0x14 < (int)uVar3) {
        uVar8 = uVar3 - 0x14;
        uVar7 = 4;
        if (uVar8 < 4) {
          uVar7 = uVar8;
        }
        memcpy(__dest,result->digits + 0x14,(ulong)(uVar7 * 2));
        if (uVar3 < 0x18) {
          memset(__dest + uVar8,0,(ulong)uVar3 * -2 + 0x30);
        }
        local_50.digits[4] = local_50.digits[0];
        local_50.digits[5] = local_50.digits[1];
        local_50.digits[6] = local_50.digits[2];
        local_50.digits[7] = local_50.digits[3];
        local_50.digits[8] = local_50.digits[0];
        local_50.digits[9] = local_50.digits[1];
        local_50.digits[10] = local_50.digits[2];
        local_50.digits[0xb] = local_50.digits[3];
        local_50.len = 0xc;
        lVar9 = 0xd;
        do {
          if (local_50.digits[lVar9 + -2] != 0) break;
          local_50.len = (int)lVar9 + -2;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 1);
        add<13,13>(this,&this->super_gfint,&local_50);
      }
    }
  }
  return;
}

Assistant:

void reduce(const bigint<RESULT_DIGITS> &result)
    {
#if GF_BITS==192
        len = min(result.len, GF_DIGITS);
        memcpy(digits, result.digits, len*sizeof(digit));
        shrink();

        if(result.len > 192/BI_DIGIT_BITS)
        {
            gfield s;
            memcpy(s.digits, &result.digits[192/BI_DIGIT_BITS], min(result.len-192/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
            if(result.len < 256/BI_DIGIT_BITS) memset(&s.digits[result.len-192/BI_DIGIT_BITS], 0, (256/BI_DIGIT_BITS-result.len)*sizeof(digit));
            memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
            s.len = 128/BI_DIGIT_BITS;
            s.shrink();
            add(s);

            if(result.len > 256/BI_DIGIT_BITS)
            {
                memset(s.digits, 0, 64/BI_DIGIT_BITS*sizeof(digit));
                memcpy(&s.digits[64/BI_DIGIT_BITS], &result.digits[256/BI_DIGIT_BITS], min(result.len-256/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                if(result.len < 320/BI_DIGIT_BITS) memset(&s.digits[result.len+(64-256)/BI_DIGIT_BITS], 0, (320/BI_DIGIT_BITS-result.len)*sizeof(digit));
                memcpy(&s.digits[128/BI_DIGIT_BITS], &s.digits[64/BI_DIGIT_BITS], 64/BI_DIGIT_BITS*sizeof(digit));
                s.len = GF_DIGITS;
                s.shrink();
                add(s);

                if(result.len > 320/BI_DIGIT_BITS)
                {
                    memcpy(s.digits, &result.digits[320/BI_DIGIT_BITS], min(result.len-320/BI_DIGIT_BITS, 64/BI_DIGIT_BITS)*sizeof(digit));
                    if(result.len < 384/BI_DIGIT_BITS) memset(&s.digits[result.len-320/BI_DIGIT_BITS], 0, (384/BI_DIGIT_BITS-result.len)*sizeof(digit));
                    memcpy(&s.digits[64/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    memcpy(&s.digits[128/BI_DIGIT_BITS], s.digits, 64/BI_DIGIT_BITS*sizeof(digit));
                    s.len = GF_DIGITS;
                    s.shrink();
                    add(s);
                }
            }
        }
        else if(*this >= P) gfint::sub(*this, P);
#else
#error Unsupported GF
#endif
    }